

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score.c
# Opt level: O0

size_t highscore_add(high_score *entry,high_score *scores,size_t sz)

{
  size_t sVar1;
  size_t slot;
  size_t sz_local;
  high_score *scores_local;
  high_score *entry_local;
  
  sVar1 = highscore_where(entry,scores,sz);
  memmove(scores + sVar1 + 1,scores + sVar1,((sz - 1) - sVar1) * 0x7e);
  memcpy(scores + sVar1,entry,0x7e);
  return sVar1;
}

Assistant:

size_t highscore_add(const struct high_score *entry, struct high_score scores[],
					 size_t sz)
{
	size_t slot = highscore_where(entry, scores, sz);

	memmove(&scores[slot + 1], &scores[slot],
			sizeof(struct high_score) * (sz - 1 - slot));
	memcpy(&scores[slot], entry, sizeof(struct high_score));

	return slot;
}